

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCodeModel
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmMakefile *this_00;
  _Base_ptr p_Var1;
  long lVar2;
  undefined8 *puVar3;
  bool bVar4;
  Value *pVVar5;
  char *pcVar6;
  ulong uVar7;
  _Rb_tree_node_base *p_Var8;
  cmake *pcVar9;
  _Base_ptr p_Var10;
  undefined8 *puVar11;
  pointer value;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> list;
  Value pObj;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> makefiles;
  Value result;
  undefined8 *local_248;
  undefined8 *puStack_240;
  long local_238;
  cmServerResponse *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  ValueHolder local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  cmServerRequest *local_1e0;
  ValueHolder local_1d8;
  undefined8 local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  cmake *local_1b0;
  string *local_1a8;
  _Rb_tree_node_base *local_1a0;
  ValueHolder local_198;
  undefined8 *local_190;
  long local_188;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_230 = __return_storage_ptr__;
  local_1e0 = request;
  if (this->m_State == STATE_COMPUTED) {
    Json::Value::Value(&local_148,objectValue);
    pcVar9 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
             super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
             super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
    Json::Value::Value(&local_170,arrayValue);
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&local_198,
               &pcVar9->GlobalGenerator->Makefiles);
    if (local_198 != local_190) {
      cmMakefile::GetConfigurations
                ((string *)&local_208,*(cmMakefile **)local_198.string_,&local_228,true);
      if (local_208 != &local_1f8) {
        operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
      }
      if (local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_1d0 = 0;
        local_1c8._M_local_buf[0] = '\0';
        local_1d8.string_ = (char *)&local_1c8;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8.string_,
                          CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0])
                          + 1);
        }
      }
    }
    if (local_198 != (undefined8 *)0x0) {
      operator_delete(local_198.string_,local_188 - (long)local_198);
    }
    local_1a8 = local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      value = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = pcVar9;
      do {
        Json::Value::Value(&local_d0,objectValue);
        Json::Value::Value(&local_a8,value);
        pVVar5 = Json::Value::operator[](&local_d0,&kNAME_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_a8);
        Json::Value::~Value(&local_a8);
        Json::Value::Value(&local_120,arrayValue);
        p_Var8 = *(_Base_ptr *)((long)&(pcVar9->GlobalGenerator->ProjectMap)._M_t._M_impl + 0x18);
        local_1a0 = (_Rb_tree_node_base *)
                    ((long)&(pcVar9->GlobalGenerator->ProjectMap)._M_t._M_impl + 8);
        if (p_Var8 != local_1a0) {
          do {
            Json::Value::Value((Value *)&local_1d8,objectValue);
            Json::Value::Value((Value *)&local_198,(string *)(p_Var8 + 1));
            pVVar5 = Json::Value::operator[]((Value *)&local_1d8,&kNAME_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar5,(Value *)&local_198);
            Json::Value::~Value((Value *)&local_198);
            if (*(_Base_ptr *)(p_Var8 + 2) == p_Var8[2]._M_parent) {
              __assert_fail("!projectIt.second.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                            ,0x3a7,"Json::Value DumpProjectList(const cmake *, const std::string &)"
                           );
            }
            this_00 = *(cmMakefile **)(*(long *)*(_Base_ptr *)(p_Var8 + 2) + 0x28);
            pcVar6 = cmMakefile::GetCurrentSourceDirectory(this_00);
            Json::Value::Value(&local_58,pcVar6);
            pVVar5 = Json::Value::operator[]((Value *)&local_1d8,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar5,&local_58);
            Json::Value::~Value(&local_58);
            pcVar6 = cmMakefile::GetCurrentBinaryDirectory(this_00);
            Json::Value::Value(&local_80,pcVar6);
            pVVar5 = Json::Value::operator[]((Value *)&local_1d8,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar5,&local_80);
            Json::Value::~Value(&local_80);
            Json::Value::Value(&local_f8,arrayValue);
            local_248 = (undefined8 *)0x0;
            puStack_240 = (undefined8 *)0x0;
            local_238 = 0;
            p_Var1 = p_Var8[2]._M_parent;
            for (p_Var10 = *(_Base_ptr *)(p_Var8 + 2); puVar3 = puStack_240, puVar11 = local_248,
                p_Var10 != p_Var1; p_Var10 = (_Base_ptr)&p_Var10->_M_parent) {
              std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                        ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                         &local_208,
                         (vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                         (*(long *)p_Var10 + 0x108));
              std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                        ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_248
                         ,puStack_240,local_208.int_,local_200);
              if (local_208 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_208.string_,local_1f8._M_allocated_capacity - (long)local_208)
                ;
              }
            }
            if (local_248 != puStack_240) {
              uVar7 = (long)puStack_240 - (long)local_248 >> 3;
              lVar2 = 0x3f;
              if (uVar7 != 0) {
                for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_248,puStack_240,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar11,puVar3);
              puVar11 = local_248;
              puVar3 = puStack_240;
            }
            for (; puVar11 != puVar3; puVar11 = puVar11 + 1) {
              DumpTarget((Value *)&local_208,(cmGeneratorTarget *)*puVar11,value);
              bVar4 = Json::Value::isNull((Value *)&local_208);
              if (!bVar4) {
                Json::Value::append(&local_f8,(Value *)&local_208);
              }
              Json::Value::~Value((Value *)&local_208);
            }
            if (local_248 != (undefined8 *)0x0) {
              operator_delete(local_248,local_238 - (long)local_248);
            }
            pVVar5 = Json::Value::operator[]((Value *)&local_1d8,&kTARGETS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar5,&local_f8);
            Json::Value::~Value(&local_f8);
            Json::Value::append(&local_120,(Value *)&local_1d8);
            Json::Value::~Value((Value *)&local_1d8);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          } while (p_Var8 != local_1a0);
        }
        pVVar5 = Json::Value::operator[](&local_d0,&kPROJECTS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_120);
        Json::Value::~Value(&local_120);
        Json::Value::append(&local_170,&local_d0);
        pcVar9 = local_1b0;
        Json::Value::~Value(&local_d0);
        value = value + 1;
      } while (value != local_1a8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
    pVVar5 = Json::Value::operator[](&local_148,&kCONFIGURATIONS_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_170);
    Json::Value::~Value(&local_170);
    cmServerRequest::Reply(local_230,local_1e0,&local_148);
    Json::Value::~Value(&local_148);
  }
  else {
    local_208.string_ = (char *)&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"No build system was generated yet.","");
    cmServerRequest::ReportError(local_230,local_1e0,(string *)&local_208);
    if (local_208 != &local_1f8) {
      operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
    }
  }
  return local_230;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCodeModel(
  const cmServerRequest& request)
{
  if (this->m_State != STATE_COMPUTED) {
    return request.ReportError("No build system was generated yet.");
  }

  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(this->CMakeInstance());
  return request.Reply(result);
}